

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::AttributeGroup::init
          (AttributeGroup *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  InputType IVar2;
  OutputType OVar3;
  TestIterationType type;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  DrawTest *pDVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  string desc;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  DrawTest *local_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  long *local_260;
  undefined8 local_258;
  long local_250;
  undefined8 uStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  string local_220;
  AttributeGroup *local_200;
  DrawTestSpec local_1f8;
  undefined1 local_1a8 [28];
  undefined8 local_18c;
  undefined8 uStack_184;
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  local_170 [2];
  ios_base local_138 [264];
  
  type = (uint)(this->m_method == DRAWMETHOD_DRAWELEMENTS_RANGED) * 2;
  if ((this->m_method & ~DRAWMETHOD_DRAWELEMENTS_RANGED) == DRAWMETHOD_DRAWARRAYS_INSTANCED) {
    type = TYPE_INSTANCE_COUNT;
  }
  pDVar5 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"single_attribute",
             "Single attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_1a8);
  local_1a8._0_4_ = 3;
  local_1a8._4_4_ = this->m_primitive;
  local_1a8._8_4_ = 5;
  local_1a8._12_4_ = this->m_method;
  local_1a8._16_4_ = this->m_indexType;
  local_1a8._20_4_ = 0;
  local_1a8._24_4_ = this->m_indexStorage;
  local_18c._0_4_ = 0;
  local_18c._4_4_ = 0;
  uStack_184._0_4_ = 0;
  uStack_184._4_4_ = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(local_170,1);
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->storage = STORAGE_BUFFER;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->usage = USAGE_STATIC_DRAW;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 2;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  addTestIterations(pDVar5,(DrawTestSpec *)local_1a8,type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar5);
  if (local_170[0].
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170[0].
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar5 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"multiple_attributes",
             "Multiple attribute arrays.");
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_1a8);
  local_1a8._0_4_ = 3;
  local_1a8._4_4_ = this->m_primitive;
  local_1a8._8_4_ = 5;
  local_1a8._12_4_ = this->m_method;
  local_1a8._16_4_ = this->m_indexType;
  local_1a8._20_4_ = 0;
  local_1a8._24_4_ = this->m_indexStorage;
  local_18c._0_4_ = 0;
  local_18c._4_4_ = 0;
  uStack_184._0_4_ = 0;
  uStack_184._4_4_ = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(local_170,2);
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->storage = STORAGE_BUFFER;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->usage = USAGE_STATIC_DRAW;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].storage = STORAGE_BUFFER;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].usage = USAGE_STATIC_DRAW;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  addTestIterations(pDVar5,(DrawTestSpec *)local_1a8,type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar5);
  if (local_170[0].
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170[0].
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar5 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"instanced_attributes",
             "Instanced attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_1a8);
  local_1a8._0_4_ = 3;
  local_1a8._4_4_ = this->m_primitive;
  local_1a8._8_4_ = 5;
  local_1a8._12_4_ = this->m_method;
  local_1a8._16_4_ = this->m_indexType;
  local_1a8._20_4_ = 0;
  local_1a8._24_4_ = this->m_indexStorage;
  local_18c._0_4_ = 0;
  local_18c._4_4_ = 0;
  uStack_184._0_4_ = 0;
  uStack_184._4_4_ = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(local_170,3);
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->storage = STORAGE_BUFFER;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->usage = USAGE_STATIC_DRAW;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_170[0].
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].storage = STORAGE_BUFFER;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].usage = USAGE_STATIC_DRAW;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 1;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].additionalPositionAttribute = true;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].inputType = INPUTTYPE_FLOAT;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].outputType = OUTPUTTYPE_VEC2;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].storage = STORAGE_BUFFER;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].usage = USAGE_STATIC_DRAW;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].componentCount = 3;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].offset = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].stride = 0;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].normalize = false;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].instanceDivisor = 1;
  local_170[0].
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].useDefaultAttribute = false;
  addTestIterations(pDVar5,(DrawTestSpec *)local_1a8,type);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar5);
  if (local_170[0].
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170[0].
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170[0].
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_288 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (local_288,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"default_attribute",
             "Attribute specified with glVertexAttrib*.");
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  local_1f8.apiType.m_bits = 3;
  local_1f8.primitive = this->m_primitive;
  local_1f8.primitiveCount = 5;
  local_1f8.drawMethod = this->m_method;
  local_1f8.indexType = this->m_indexType;
  local_1f8.indexPointerOffset = 0;
  local_1f8.indexStorage = this->m_indexStorage;
  local_1f8.first = 0;
  local_1f8.indexMin = 0;
  local_1f8.indexMax = 0x14;
  local_1f8.instanceCount = 1;
  local_200 = this;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_1f8.attribs,2);
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->storage = STORAGE_BUFFER;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->usage = USAGE_STATIC_DRAW;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 2;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  lVar10 = 8;
  uVar9 = extraout_RDX;
  do {
    IVar2 = *(InputType *)(&UNK_00b1ca78 + lVar10);
    deqp::gls::DrawTestSpec::inputTypeToString_abi_cxx11_
              (&local_220,(DrawTestSpec *)(ulong)IVar2,(InputType)uVar9);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    iVar4 = *(int *)((long)&DAT_00b1ca80 + lVar10);
    std::ostream::operator<<((string *)local_1a8,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      uVar9 = local_220.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_238 + local_220._M_string_length) {
      uVar11 = 0xf;
      if (local_240 != local_230) {
        uVar11 = local_230[0];
      }
      if (uVar11 < local_238 + local_220._M_string_length) goto LAB_006507c6;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_240,0,(char *)0x0,(ulong)local_220._M_dataplus._M_p);
    }
    else {
LAB_006507c6:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_240);
    }
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_298 = *plVar7;
      uStack_290 = puVar6[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar7;
      local_2a8 = (long *)*puVar6;
    }
    local_2a0 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_280 = &local_270;
    puVar8 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar8) {
      local_270 = *puVar8;
      lStack_268 = plVar7[3];
    }
    else {
      local_270 = *puVar8;
      local_280 = (ulong *)*plVar7;
    }
    local_278 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    OVar3 = *(OutputType *)(&UNK_00b1ca7c + lVar10);
    deqp::gls::DrawTestSpec::outputTypeToString_abi_cxx11_
              ((string *)local_1a8,(DrawTestSpec *)(ulong)OVar3,(OutputType)local_278);
    uVar11 = 0xf;
    if (local_280 != &local_270) {
      uVar11 = local_270;
    }
    uVar1 = CONCAT44(local_1a8._12_4_,local_1a8._8_4_) + local_278;
    if (uVar11 < uVar1) {
      uVar11 = 0xf;
      if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
        uVar11 = CONCAT44(local_1a8._20_4_,local_1a8._16_4_);
      }
      if (uVar11 < uVar1) goto LAB_006508e8;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)local_280);
    }
    else {
LAB_006508e8:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_280,CONCAT44(local_1a8._4_4_,local_1a8._0_4_));
    }
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_250 = *plVar7;
      uStack_248 = puVar6[3];
      local_260 = &local_250;
    }
    else {
      local_250 = *plVar7;
      local_260 = (long *)*puVar6;
    }
    local_258 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                      CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].inputType = IVar2;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].outputType = OVar3;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = STORAGE_BUFFER;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].usage = USAGE_STATIC_DRAW;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].componentCount = iVar4;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
    local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = true;
    deqp::gls::DrawTest::addIteration(local_288,&local_1f8,(char *)local_260);
    uVar9 = extraout_RDX_00;
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
      uVar9 = extraout_RDX_01;
    }
    lVar10 = lVar10 + 0xc;
    if (lVar10 == 0x38) {
      tcu::TestNode::addChild((TestNode *)local_200,(TestNode *)local_288);
      iVar4 = extraout_EAX;
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar4 = extraout_EAX_00;
      }
      return iVar4;
    }
  } while( true );
}

Assistant:

void AttributeGroup::init (void)
{
	// select test type
	const bool				instanced			= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED) ||
												  (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED);
	const bool				ranged				= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED);
	const TestIterationType	testType			= (instanced) ? (TYPE_INSTANCE_COUNT) : ((ranged) ? (TYPE_INDEX_RANGE) : (TYPE_DRAW_COUNT));

	// Single attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "single_attribute", "Single attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;

		spec.attribs.resize(1);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		addTestIterations(test, spec, testType);

		this->addChild(test);
	}

	// Multiple attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "multiple_attributes", "Multiple attribute arrays.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 4;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		spec.attribs[1].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount			= 2;
		spec.attribs[1].offset					= 0;
		spec.attribs[1].stride					= 0;
		spec.attribs[1].normalize				= false;
		spec.attribs[1].instanceDivisor			= 0;
		spec.attribs[1].useDefaultAttribute		= false;

		addTestIterations(test, spec, testType);

		this->addChild(test);
	}

	// Multiple attribute, second one divided
	{
		gls::DrawTest*		test					= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "instanced_attributes", "Instanced attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType								= glu::ApiType::es(3,0);
		spec.primitive								= m_primitive;
		spec.primitiveCount							= 5;
		spec.drawMethod								= m_method;
		spec.indexType								= m_indexType;
		spec.indexPointerOffset						= 0;
		spec.indexStorage							= m_indexStorage;
		spec.first									= 0;
		spec.indexMin								= 0;
		spec.indexMax								= 0;
		spec.instanceCount							= 1;

		spec.attribs.resize(3);

		spec.attribs[0].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount				= 4;
		spec.attribs[0].offset						= 0;
		spec.attribs[0].stride						= 0;
		spec.attribs[0].normalize					= false;
		spec.attribs[0].instanceDivisor				= 0;
		spec.attribs[0].useDefaultAttribute			= false;

		// Add another position component so the instances wont be drawn on each other
		spec.attribs[1].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount				= 2;
		spec.attribs[1].offset						= 0;
		spec.attribs[1].stride						= 0;
		spec.attribs[1].normalize					= false;
		spec.attribs[1].instanceDivisor				= 1;
		spec.attribs[1].useDefaultAttribute			= false;
		spec.attribs[1].additionalPositionAttribute	= true;

		// Instanced color
		spec.attribs[2].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[2].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[2].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[2].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[2].componentCount				= 3;
		spec.attribs[2].offset						= 0;
		spec.attribs[2].stride						= 0;
		spec.attribs[2].normalize					= false;
		spec.attribs[2].instanceDivisor				= 1;
		spec.attribs[2].useDefaultAttribute			= false;

		addTestIterations(test, spec, testType);

		this->addChild(test);
	}

	// Multiple attribute, second one default
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "default_attribute", "Attribute specified with glVertexAttrib*.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 20; // \note addTestIterations is not called for the spec, so we must ensure [indexMin, indexMax] is a good range
		spec.instanceCount						= 1;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		struct IOPair
		{
			gls::DrawTestSpec::InputType  input;
			gls::DrawTestSpec::OutputType output;
			int							  componentCount;
		} iopairs[] =
		{
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC2,  4 },
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC4,  2 },
			{ gls::DrawTestSpec::INPUTTYPE_INT,          gls::DrawTestSpec::OUTPUTTYPE_IVEC3, 4 },
			{ gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT, gls::DrawTestSpec::OUTPUTTYPE_UVEC2, 4 },
		};

		for (int ioNdx = 0; ioNdx < DE_LENGTH_OF_ARRAY(iopairs); ++ioNdx)
		{
			const std::string desc = gls::DrawTestSpec::inputTypeToString(iopairs[ioNdx].input) + de::toString(iopairs[ioNdx].componentCount) + " to " + gls::DrawTestSpec::outputTypeToString(iopairs[ioNdx].output);

			spec.attribs[1].inputType			= iopairs[ioNdx].input;
			spec.attribs[1].outputType			= iopairs[ioNdx].output;
			spec.attribs[1].storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			spec.attribs[1].usage				= gls::DrawTestSpec::USAGE_STATIC_DRAW;
			spec.attribs[1].componentCount		= iopairs[ioNdx].componentCount;
			spec.attribs[1].offset				= 0;
			spec.attribs[1].stride				= 0;
			spec.attribs[1].normalize			= false;
			spec.attribs[1].instanceDivisor		= 0;
			spec.attribs[1].useDefaultAttribute	= true;

			test->addIteration(spec, desc.c_str());
		}

		this->addChild(test);
	}
}